

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::BilinearPatch::CreatePatches
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,BilinearPatchMesh *mesh,Allocator alloc)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  BilinearPatch *this;
  int vb;
  size_t va;
  BilinearPatchMesh *mesh_local;
  BilinearPatch *pBVar3;
  
  uVar1 = allMeshes->nStored;
  vb = -0x80000000;
  va = uVar1;
  mesh_local = mesh;
  if (uVar1 < 0xffffffff80000000) {
    pstd::
    vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
    ::push_back(allMeshes,&mesh_local);
    va = (size_t)alloc.memoryResource;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
              (__return_storage_ptr__,(long)mesh_local->nPatches,
               (polymorphic_allocator<pbrt::ShapeHandle> *)&va);
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)mesh_local->nPatches * 0xc,4);
    pBVar3 = (BilinearPatch *)CONCAT44(extraout_var,iVar2);
    this = pBVar3;
    for (lVar5 = 0; lVar5 < mesh_local->nPatches; lVar5 = lVar5 + 1) {
      BilinearPatch(this,(int)uVar1,(int)lVar5);
      uVar4 = (ulong)pBVar3 | 0x5000000000000;
      pBVar3 = pBVar3 + 1;
      this = this + 1;
      __return_storage_ptr__->ptr[lVar5].
      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
      .bits = uVar4;
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
             ,0x3cf,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> BilinearPatch::CreatePatches(const BilinearPatchMesh *mesh,
                                                       Allocator alloc) {
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());

    allMeshes->push_back(mesh);

    pstd::vector<ShapeHandle> blps(mesh->nPatches, alloc);
    BilinearPatch *patches = alloc.allocate_object<BilinearPatch>(mesh->nPatches);
    for (int i = 0; i < mesh->nPatches; ++i) {
        alloc.construct(&patches[i], meshIndex, i);
        blps[i] = &patches[i];
    }

    return blps;
}